

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.cc
# Opt level: O2

int board::evaluate::score(Board *pos)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  undefined1 *puVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  int (*paiVar11) [10];
  long lVar12;
  ulong uVar13;
  
  bVar4 = materialDraw(pos);
  iVar5 = 0;
  if (!bVar4) {
    iVar7 = pos->material[0] - pos->material[1];
    iVar5 = iVar7 + 0x1e;
    if (pos->pNum[3] != 2) {
      iVar5 = iVar7;
    }
    iVar7 = iVar5 + -0x1e;
    if (pos->pNum[9] != 2) {
      iVar7 = iVar5;
    }
    paiVar11 = pos->pList;
    for (lVar12 = 1; paiVar11 = paiVar11 + 1, lVar12 != 0xd; lVar12 = lVar12 + 1) {
      uVar3 = pos->pNum[lVar12];
      if (pos->pNum[lVar12] < 1) {
        uVar3 = 0;
      }
      for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
        iVar5 = (*paiVar11)[uVar10];
        iVar1 = Board::PIECE_COLOR[lVar12];
        uVar13 = (ulong)iVar1;
        iVar8 = Board::PIECE_NO_TEAM[lVar12];
        lVar9 = (long)Board::SQ64[iVar5];
        if (uVar13 == 0) {
          iVar2 = *(int *)(PIECE_SQUARE_TABLE + lVar9 * 4 + (long)iVar8 * 0x100);
        }
        else {
          iVar2 = -*(int *)(PIECE_SQUARE_TABLE +
                           (long)*(int *)(MIRROR_PIECE_SQUARE_TABLE + lVar9 * 4) * 4 +
                           (long)iVar8 * 0x100);
        }
        iVar7 = iVar7 + iVar2;
        if ((int)lVar12 == 0xc) {
          if (pos->material[0] < 0x44c && pos->pNum[5] == 0) {
            puVar6 = PIECE_SQUARE_TABLE_KING_END;
          }
          else {
            puVar6 = PIECE_SQUARE_TABLE_KING_OPENING;
          }
          iVar7 = iVar7 - *(int *)(puVar6 + (long)*(int *)(MIRROR_PIECE_SQUARE_TABLE + lVar9 * 4) *
                                            4);
        }
        else if ((int)lVar12 == 6) {
          if (pos->material[1] < 0x44c && pos->pNum[0xb] == 0) {
            puVar6 = PIECE_SQUARE_TABLE_KING_END;
          }
          else {
            puVar6 = PIECE_SQUARE_TABLE_KING_OPENING;
          }
          iVar7 = iVar7 + *(int *)(puVar6 + lVar9 * 4);
        }
        else if (iVar8 == 5) {
          if ((pos->pawns[2] == 0) && ((Board::FILE_MASK[Board::FILES[iVar5]] & 1) != 0)) {
LAB_00103a09:
            iVar5 = iVar7 + -5;
            iVar7 = iVar7 + 5;
          }
          else {
            if ((pos->pawns[uVar13] != 0) || ((Board::FILE_MASK[Board::FILES[iVar5]] & 1) == 0))
            goto LAB_00103a15;
            iVar5 = iVar7 + -3;
            iVar7 = iVar7 + 3;
          }
LAB_00103a0f:
          if (iVar1 != 0) {
            iVar7 = iVar5;
          }
        }
        else if (iVar8 == 4) {
          if ((pos->pawns[2] == 0) && ((Board::FILE_MASK[Board::FILES[iVar5]] & 1) != 0)) {
            iVar5 = iVar7 + -10;
            iVar7 = iVar7 + 10;
            goto LAB_00103a0f;
          }
          if ((pos->pawns[uVar13] == 0) && ((Board::FILE_MASK[Board::FILES[iVar5]] & 1) != 0))
          goto LAB_00103a09;
        }
        else if (iVar8 == 1) {
          iVar8 = 10;
          if (iVar1 == 0) {
            iVar8 = -10;
          }
          if ((Board::ISOLATED_PAWN_MASK[lVar9] & 1) == 0) {
            iVar8 = 0;
          }
          if (pos->pawns[uVar13] != 0) {
            iVar8 = 0;
          }
          iVar7 = iVar7 + iVar8;
          if ((pos->pawns[uVar13 ^ 1] == 0) && ((Board::PASSED_PAWN_MASK[uVar13][lVar9] & 1) != 0))
          {
            iVar8 = -*(int *)(PASSED_PAWN + (long)Board::RANKS[iVar5] * 4);
            if (iVar1 == 0) {
              iVar8 = *(int *)(PASSED_PAWN + (long)Board::RANKS[iVar5] * 4);
            }
            iVar7 = iVar7 + iVar8;
          }
        }
LAB_00103a15:
      }
    }
    iVar5 = -iVar7;
    if (pos->side != 1) {
      iVar5 = iVar7;
    }
  }
  return iVar5;
}

Assistant:

int board::evaluate::score(Board& pos)
{
    if (materialDraw(pos)) {
        return 0;
    }
    int square;
    int side;
    int score = pos.getMaterial(WHITE) - pos.getMaterial(BLACK);
    if (pos.getPieceNum(WB) == 2) {
        score += BISHOP_PAIR;
    }
    if (pos.getPieceNum(BB) == 2) {
        score -= BISHOP_PAIR;
    }
    for (int piece = WP; piece <= BK; piece++) {
        for (int i = 0; i < pos.getPieceNum(piece); i++) {
            square = pos.getPieceList(piece)[i];
            side = Board::PIECE_COLOR[piece];
            if (Board::PIECE_COLOR[piece] == WHITE) {
                score += PIECE_SQUARE_TABLE[Board::PIECE_NO_TEAM[piece]][Board::SQ64[square]];
            }
            else {
                score -=
                    PIECE_SQUARE_TABLE[Board::PIECE_NO_TEAM[piece]][MIRROR_PIECE_SQUARE_TABLE[Board::SQ64[square]]];
            }
            if (piece == WK) {
                if (isEndGame(pos, WHITE)) {
                    score += PIECE_SQUARE_TABLE_KING_END[Board::SQ64[square]];
                }
                else {
                    score += PIECE_SQUARE_TABLE_KING_OPENING[Board::SQ64[square]];
                }
            }
            else if (piece == BK) {
                if (isEndGame(pos, BLACK)) {
                    score -= PIECE_SQUARE_TABLE_KING_END[MIRROR_PIECE_SQUARE_TABLE[Board::SQ64[square]]];
                }
                else {
                    score -= PIECE_SQUARE_TABLE_KING_OPENING[MIRROR_PIECE_SQUARE_TABLE[Board::SQ64[square]]];
                }
            }
            else if (Board::PIECE_NO_TEAM[piece] == WP) {
                if ((!pos.getPawns()[side]) & Board::ISOLATED_PAWN_MASK[Board::SQ64[square]]) {
                    score += PAWN_ISOLATED * (side == WHITE ? 1 : -1);
                }
                if ((!pos.getPawns()[side ^ 1]) & Board::PASSED_PAWN_MASK[side][Board::SQ64[square]]) {
                    score += PASSED_PAWN[Board::RANKS[square]] * (side == WHITE ? 1 : -1);
                }
            }
            else if (Board::PIECE_NO_TEAM[piece] == WR) {
                if ((!pos.getPawns()[BOTH]) & Board::FILE_MASK[Board::FILES[square]]) {
                    score += ROOK_OPEN_FILE * (side == WHITE ? 1 : -1);
                }
                else if ((!pos.getPawns()[side]) & Board::FILE_MASK[Board::FILES[square]]) {
                    score += ROOK_SEMI_OPEN_FILE * (side == WHITE ? 1 : -1);
                }
            }
            else if (Board::PIECE_NO_TEAM[piece] == WQ) {
                if ((!pos.getPawns()[BOTH]) & Board::FILE_MASK[Board::FILES[square]]) {
                    score += QUEEN_OPEN_FILE * (side == WHITE ? 1 : -1);
                }
                else if ((!pos.getPawns()[side]) & Board::FILE_MASK[Board::FILES[square]]) {
                    score += QUEEN_SEMI_OPEN_FILE * (side == WHITE ? 1 : -1);
                }
            }
        }
    }
    if (pos.getSide() == BLACK) {
        score = -score;
    }
    return score;
}